

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O2

void AddSingleLiteralWithCostModel
               (uint32_t *argb,VP8LColorCache *hashers,CostModel *cost_model,int idx,
               int use_color_cache,int64_t prev_cost,int64_t *cost,uint16_t *dist_array)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  int64_t cost_val;
  
  uVar1 = argb[idx];
  if (use_color_cache != 0) {
    uVar3 = uVar1 * 0x1e35a7bd >> ((byte)hashers->hash_shift & 0x1f);
    if ((-1 < (int)uVar3) && (hashers->colors[(int)uVar3] == uVar1)) {
      lVar2 = (ulong)cost_model->literal[(int)(uVar3 + 0x118)] * 0x44;
      goto LAB_0013f782;
    }
    hashers->colors[(int)uVar3] = uVar1;
  }
  lVar2 = ((ulong)cost_model->blue[uVar1 & 0xff] + (ulong)cost_model->literal[uVar1 >> 8 & 0xff] +
          (ulong)*(uint *)((long)cost_model->red + (ulong)(uVar1 >> 0xe & 0x3fc)) +
          (ulong)cost_model->alpha[uVar1 >> 0x18]) * 0x52;
LAB_0013f782:
  lVar2 = (lVar2 + 0x32U) / 100 + prev_cost;
  if (lVar2 < cost[idx]) {
    cost[idx] = lVar2;
    dist_array[idx] = 1;
  }
  return;
}

Assistant:

static WEBP_INLINE void AddSingleLiteralWithCostModel(
    const uint32_t* const argb, VP8LColorCache* const hashers,
    const CostModel* const cost_model, int idx, int use_color_cache,
    int64_t prev_cost, int64_t* const cost, uint16_t* const dist_array) {
  int64_t cost_val = prev_cost;
  const uint32_t color = argb[idx];
  const int ix = use_color_cache ? VP8LColorCacheContains(hashers, color) : -1;
  if (ix >= 0) {
    // use_color_cache is true and hashers contains color
    cost_val += DivRound(GetCacheCost(cost_model, ix) * 68, 100);
  } else {
    if (use_color_cache) VP8LColorCacheInsert(hashers, color);
    cost_val += DivRound(GetLiteralCost(cost_model, color) * 82, 100);
  }
  if (cost[idx] > cost_val) {
    cost[idx] = cost_val;
    dist_array[idx] = 1;  // only one is inserted.
  }
}